

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O1

void embree::sse42::
     BVHNIntersectorKHybrid<4,_4,_16777232,_false,_embree::sse42::ArrayIntersectorK_1<4,_embree::sse42::TriangleMiMBIntersectorKMoeller<4,_4,_true>_>,_true>
     ::intersect1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,
                 RayHitK<4> *ray,TravRayK<4,_false> *tray,RayQueryContext *context)

{
  undefined8 *puVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  float *pfVar5;
  float *pfVar6;
  float *pfVar7;
  float *pfVar8;
  float *pfVar9;
  float *pfVar10;
  float *pfVar11;
  float *pfVar12;
  float *pfVar13;
  float *pfVar14;
  float *pfVar15;
  float *pfVar16;
  float *pfVar17;
  float *pfVar18;
  float *pfVar19;
  float *pfVar20;
  float *pfVar21;
  float *pfVar22;
  float *pfVar23;
  float *pfVar24;
  undefined4 uVar25;
  int iVar26;
  undefined4 uVar27;
  size_t sVar28;
  undefined8 uVar29;
  Scene *pSVar30;
  Geometry *pGVar31;
  long lVar32;
  long lVar33;
  bool bVar34;
  bool bVar35;
  bool bVar36;
  bool bVar37;
  undefined8 uVar38;
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  StackItemT<embree::NodeRefPtr<4>_> *pSVar41;
  int iVar42;
  int iVar43;
  AABBNodeMB4D *node1;
  ulong uVar44;
  long lVar45;
  ulong uVar46;
  RayHitK<4> *pRVar47;
  ulong uVar48;
  float *vertices;
  ulong uVar49;
  ulong uVar50;
  ulong uVar51;
  ulong uVar52;
  ulong uVar53;
  long lVar54;
  undefined4 uVar55;
  ulong in_R10;
  ulong uVar56;
  ulong uVar57;
  Scene *scene;
  size_t sVar58;
  ulong uVar59;
  ulong uVar60;
  ulong uVar61;
  float fVar62;
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  anon_union_16_2_9473010e_for_vboolf_impl<4>_1 aVar74;
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  float fVar80;
  float fVar81;
  float fVar82;
  float fVar91;
  float fVar93;
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  StackItemT<embree::NodeRefPtr<4>_> SVar85;
  undefined1 auVar86 [16];
  float fVar92;
  float fVar94;
  float fVar95;
  float fVar96;
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  float fVar97;
  float fVar98;
  float fVar103;
  float fVar105;
  undefined1 auVar99 [16];
  StackItemT<embree::NodeRefPtr<4>_> SVar100;
  float fVar104;
  float fVar106;
  float fVar107;
  float fVar108;
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  float fVar109;
  uint uVar110;
  float fVar116;
  float fVar118;
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  uint uVar117;
  uint uVar119;
  float fVar120;
  uint uVar121;
  undefined1 auVar115 [16];
  float fVar122;
  float fVar123;
  float fVar129;
  float fVar130;
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  StackItemT<embree::NodeRefPtr<4>_> SVar128;
  float fVar131;
  float fVar132;
  float fVar135;
  float fVar136;
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  float fVar137;
  float fVar139;
  undefined1 auVar138 [16];
  float fVar140;
  float fVar141;
  float fVar142;
  float fVar143;
  float fVar144;
  float fVar145;
  float fVar146;
  float fVar147;
  float fVar148;
  float fVar149;
  float fVar150;
  float fVar151;
  float fVar152;
  float fVar153;
  float fVar154;
  float fVar155;
  float fVar156;
  float fVar157;
  float fVar158;
  float fVar159;
  float fVar160;
  float fVar161;
  float fVar162;
  float fVar163;
  float fVar164;
  float fVar165;
  float fVar166;
  float fVar167;
  int iVar168;
  int iVar169;
  int iVar170;
  float local_1268;
  float fStack_1264;
  float fStack_1260;
  float fStack_125c;
  undefined8 local_1258;
  float fStack_1230;
  float fStack_122c;
  vbool<4> valid;
  undefined8 local_1208;
  undefined8 uStack_1200;
  undefined8 *local_11f0;
  ulong local_11e8;
  ulong local_11e0;
  ulong local_11d8;
  ulong local_11d0;
  StackItemT<embree::NodeRefPtr<4>_> *local_11c8;
  Scene *local_11c0;
  long local_11b8;
  long local_11b0;
  RTCFilterFunctionNArguments args;
  undefined8 local_1178;
  undefined8 uStack_1170;
  vfloat<4> tNear;
  float local_1108 [4];
  float local_10f8 [4];
  undefined1 local_10e8 [16];
  undefined1 local_10d8 [16];
  undefined1 local_10c8 [16];
  undefined1 local_10b8 [16];
  int local_10a8;
  int iStack_10a4;
  int iStack_10a0;
  int iStack_109c;
  float local_1098;
  float fStack_1094;
  float fStack_1090;
  float fStack_108c;
  float local_1088;
  float fStack_1084;
  float fStack_1080;
  float fStack_107c;
  float local_1078;
  float fStack_1074;
  float fStack_1070;
  float fStack_106c;
  float local_1068;
  float fStack_1064;
  float fStack_1060;
  float fStack_105c;
  float local_1058;
  float fStack_1054;
  float fStack_1050;
  float fStack_104c;
  float local_1048;
  float fStack_1044;
  float fStack_1040;
  float fStack_103c;
  undefined8 local_1038;
  float fStack_1030;
  float fStack_102c;
  float local_1028;
  float fStack_1024;
  float fStack_1020;
  float fStack_101c;
  undefined8 local_1018;
  undefined8 uStack_1010;
  HitK<4> h;
  StackItemT<embree::NodeRefPtr<4>_> stack [244];
  
  local_11c8 = stack + 1;
  stack[0].ptr.ptr = root.ptr;
  stack[0].dist = 0;
  local_1048 = *(float *)((long)&(tray->org).field_0 + k * 4);
  local_1058 = *(float *)((long)&(tray->org).field_0 + k * 4 + 0x10);
  local_1068 = *(float *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  local_1078 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  local_1088 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x10);
  local_1098 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  local_11d0 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  local_11d8 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x10);
  local_11e0 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  local_11e8 = local_11d0 ^ 0x10;
  uVar49 = local_11d8 ^ 0x10;
  uVar51 = local_11e0 ^ 0x10;
  local_10a8 = (tray->tnear).field_0.i[k];
  iVar43 = (tray->tfar).field_0.i[k];
  auVar75._4_4_ = iVar43;
  auVar75._0_4_ = iVar43;
  auVar75._8_4_ = iVar43;
  auVar75._12_4_ = iVar43;
  local_11f0 = (undefined8 *)(mm_lookupmask_ps + (long)(1 << ((byte)k & 0x1f)) * 0x10);
  fStack_1044 = local_1048;
  fStack_1040 = local_1048;
  fStack_103c = local_1048;
  fStack_1054 = local_1058;
  fStack_1050 = local_1058;
  fStack_104c = local_1058;
  fStack_1064 = local_1068;
  fStack_1060 = local_1068;
  fStack_105c = local_1068;
  fStack_1074 = local_1078;
  fStack_1070 = local_1078;
  fStack_106c = local_1078;
  fStack_1084 = local_1088;
  fStack_1080 = local_1088;
  fStack_107c = local_1088;
  fStack_1094 = local_1098;
  fStack_1090 = local_1098;
  fStack_108c = local_1098;
  iStack_10a4 = local_10a8;
  iStack_10a0 = local_10a8;
  iStack_109c = local_10a8;
  uVar59 = local_11e8;
  uVar46 = local_11e0;
  uVar48 = local_11d0;
  uVar50 = local_11d8;
  fVar62 = local_1048;
  fVar80 = local_1048;
  fVar122 = local_1048;
  fVar157 = local_1048;
  fVar82 = local_1058;
  fVar92 = local_1058;
  fVar132 = local_1058;
  fVar135 = local_1058;
  fVar81 = local_1068;
  fVar91 = local_1068;
  fVar93 = local_1068;
  fVar94 = local_1068;
  fVar95 = local_1078;
  fVar96 = local_1078;
  fVar97 = local_1078;
  fVar98 = local_1078;
  fVar103 = local_1088;
  fVar104 = local_1088;
  fVar105 = local_1088;
  fVar106 = local_1088;
  fVar107 = local_1098;
  fVar108 = local_1098;
  fVar109 = local_1098;
  fVar116 = local_1098;
  iVar43 = local_10a8;
  iVar168 = local_10a8;
  iVar169 = local_10a8;
  iVar170 = local_10a8;
  local_1258 = k;
  do {
    do {
      do {
        if (local_11c8 == stack) {
          return;
        }
        pSVar41 = local_11c8 + -1;
        local_11c8 = local_11c8 + -1;
      } while (*(float *)(ray + k * 4 + 0x80) <= (float)pSVar41->dist &&
               (float)pSVar41->dist != *(float *)(ray + k * 4 + 0x80));
      sVar58 = (local_11c8->ptr).ptr;
      do {
        if ((sVar58 & 8) == 0) {
          uVar44 = sVar58 & 0xfffffffffffffff0;
          fVar118 = *(float *)(ray + k * 4 + 0x70);
          pfVar22 = (float *)(uVar44 + 0x80 + uVar48);
          pfVar9 = (float *)(uVar44 + 0x20 + uVar48);
          auVar111._0_4_ = ((*pfVar22 * fVar118 + *pfVar9) - fVar62) * fVar95;
          auVar111._4_4_ = ((pfVar22[1] * fVar118 + pfVar9[1]) - fVar80) * fVar96;
          auVar111._8_4_ = ((pfVar22[2] * fVar118 + pfVar9[2]) - fVar122) * fVar97;
          auVar111._12_4_ = ((pfVar22[3] * fVar118 + pfVar9[3]) - fVar157) * fVar98;
          auVar83._4_4_ = iVar168;
          auVar83._0_4_ = iVar43;
          auVar83._8_4_ = iVar169;
          auVar83._12_4_ = iVar170;
          pfVar22 = (float *)(uVar44 + 0x80 + uVar50);
          pfVar9 = (float *)(uVar44 + 0x20 + uVar50);
          auVar83 = maxps(auVar83,auVar111);
          auVar134._0_4_ = ((*pfVar22 * fVar118 + *pfVar9) - fVar82) * fVar103;
          auVar134._4_4_ = ((pfVar22[1] * fVar118 + pfVar9[1]) - fVar92) * fVar104;
          auVar134._8_4_ = ((pfVar22[2] * fVar118 + pfVar9[2]) - fVar132) * fVar105;
          auVar134._12_4_ = ((pfVar22[3] * fVar118 + pfVar9[3]) - fVar135) * fVar106;
          pfVar22 = (float *)(uVar44 + 0x80 + uVar46);
          pfVar9 = (float *)(uVar44 + 0x20 + uVar46);
          auVar126._0_4_ = ((*pfVar22 * fVar118 + *pfVar9) - fVar81) * fVar107;
          auVar126._4_4_ = ((pfVar22[1] * fVar118 + pfVar9[1]) - fVar91) * fVar108;
          auVar126._8_4_ = ((pfVar22[2] * fVar118 + pfVar9[2]) - fVar93) * fVar109;
          auVar126._12_4_ = ((pfVar22[3] * fVar118 + pfVar9[3]) - fVar94) * fVar116;
          auVar111 = maxps(auVar134,auVar126);
          tNear.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)maxps(auVar83,auVar111);
          pfVar23 = (float *)(uVar44 + 0x80 + uVar59);
          pfVar9 = (float *)(uVar44 + 0x20 + uVar59);
          pfVar24 = (float *)(uVar44 + 0x80 + uVar49);
          pfVar22 = (float *)(uVar44 + 0x20 + uVar49);
          auVar112._0_4_ = ((*pfVar23 * fVar118 + *pfVar9) - fVar62) * fVar95;
          auVar112._4_4_ = ((pfVar23[1] * fVar118 + pfVar9[1]) - fVar80) * fVar96;
          auVar112._8_4_ = ((pfVar23[2] * fVar118 + pfVar9[2]) - fVar122) * fVar97;
          auVar112._12_4_ = ((pfVar23[3] * fVar118 + pfVar9[3]) - fVar157) * fVar98;
          auVar124._0_4_ = ((*pfVar24 * fVar118 + *pfVar22) - fVar82) * fVar103;
          auVar124._4_4_ = ((pfVar24[1] * fVar118 + pfVar22[1]) - fVar92) * fVar104;
          auVar124._8_4_ = ((pfVar24[2] * fVar118 + pfVar22[2]) - fVar132) * fVar105;
          auVar124._12_4_ = ((pfVar24[3] * fVar118 + pfVar22[3]) - fVar135) * fVar106;
          pfVar22 = (float *)(uVar44 + 0x80 + uVar51);
          pfVar9 = (float *)(uVar44 + 0x20 + uVar51);
          auVar127._0_4_ = ((*pfVar22 * fVar118 + *pfVar9) - fVar81) * fVar107;
          auVar127._4_4_ = ((pfVar22[1] * fVar118 + pfVar9[1]) - fVar91) * fVar108;
          auVar127._8_4_ = ((pfVar22[2] * fVar118 + pfVar9[2]) - fVar93) * fVar109;
          auVar127._12_4_ = ((pfVar22[3] * fVar118 + pfVar9[3]) - fVar94) * fVar116;
          auVar111 = minps(auVar124,auVar127);
          auVar83 = minps(auVar75,auVar112);
          auVar83 = minps(auVar83,auVar111);
          if (((uint)sVar58 & 7) == 6) {
            bVar34 = (fVar118 < *(float *)(uVar44 + 0xf0) && *(float *)(uVar44 + 0xe0) <= fVar118)
                     && tNear.field_0._0_4_ <= auVar83._0_4_;
            bVar35 = (fVar118 < *(float *)(uVar44 + 0xf4) && *(float *)(uVar44 + 0xe4) <= fVar118)
                     && tNear.field_0._4_4_ <= auVar83._4_4_;
            bVar36 = (fVar118 < *(float *)(uVar44 + 0xf8) && *(float *)(uVar44 + 0xe8) <= fVar118)
                     && tNear.field_0._8_4_ <= auVar83._8_4_;
            bVar37 = (fVar118 < *(float *)(uVar44 + 0xfc) && *(float *)(uVar44 + 0xec) <= fVar118)
                     && tNear.field_0._12_4_ <= auVar83._12_4_;
          }
          else {
            bVar34 = tNear.field_0._0_4_ <= auVar83._0_4_;
            bVar35 = tNear.field_0._4_4_ <= auVar83._4_4_;
            bVar36 = tNear.field_0._8_4_ <= auVar83._8_4_;
            bVar37 = tNear.field_0._12_4_ <= auVar83._12_4_;
          }
          auVar63._0_4_ = (uint)bVar34 * -0x80000000;
          auVar63._4_4_ = (uint)bVar35 * -0x80000000;
          auVar63._8_4_ = (uint)bVar36 * -0x80000000;
          auVar63._12_4_ = (uint)bVar37 * -0x80000000;
          uVar55 = movmskps((int)in_R10,auVar63);
          in_R10 = CONCAT44((int)(in_R10 >> 0x20),uVar55);
        }
        if ((sVar58 & 8) == 0) {
          if (in_R10 == 0) {
            iVar42 = 4;
          }
          else {
            uVar44 = sVar58 & 0xfffffffffffffff0;
            lVar54 = 0;
            if (in_R10 != 0) {
              for (; (in_R10 >> lVar54 & 1) == 0; lVar54 = lVar54 + 1) {
              }
            }
            iVar42 = 0;
            sVar58 = *(size_t *)(uVar44 + lVar54 * 8);
            uVar52 = in_R10 - 1 & in_R10;
            if (uVar52 != 0) {
              uVar110 = tNear.field_0.i[lVar54];
              lVar54 = 0;
              if (uVar52 != 0) {
                for (; (uVar52 >> lVar54 & 1) == 0; lVar54 = lVar54 + 1) {
                }
              }
              sVar28 = *(size_t *)(uVar44 + lVar54 * 8);
              uVar117 = tNear.field_0.i[lVar54];
              uVar52 = uVar52 - 1 & uVar52;
              if (uVar52 == 0) {
                if (uVar110 < uVar117) {
                  (local_11c8->ptr).ptr = sVar28;
                  local_11c8->dist = uVar117;
                  local_11c8 = local_11c8 + 1;
                }
                else {
                  (local_11c8->ptr).ptr = sVar58;
                  local_11c8->dist = uVar110;
                  local_11c8 = local_11c8 + 1;
                  sVar58 = sVar28;
                }
              }
              else {
                auVar84._8_4_ = uVar110;
                auVar84._0_8_ = sVar58;
                auVar84._12_4_ = 0;
                auVar113._8_4_ = uVar117;
                auVar113._0_8_ = sVar28;
                auVar113._12_4_ = 0;
                lVar54 = 0;
                if (uVar52 != 0) {
                  for (; (uVar52 >> lVar54 & 1) == 0; lVar54 = lVar54 + 1) {
                  }
                }
                uVar29 = *(undefined8 *)(uVar44 + lVar54 * 8);
                iVar26 = tNear.field_0.i[lVar54];
                auVar99._8_4_ = iVar26;
                auVar99._0_8_ = uVar29;
                auVar99._12_4_ = 0;
                auVar64._8_4_ = -(uint)((int)uVar110 < (int)uVar117);
                uVar52 = uVar52 - 1 & uVar52;
                if (uVar52 == 0) {
                  auVar64._4_4_ = auVar64._8_4_;
                  auVar64._0_4_ = auVar64._8_4_;
                  auVar64._12_4_ = auVar64._8_4_;
                  auVar125._8_4_ = uVar117;
                  auVar125._0_8_ = sVar28;
                  auVar125._12_4_ = 0;
                  auVar126 = blendvps(auVar125,auVar84,auVar64);
                  auVar83 = blendvps(auVar84,auVar113,auVar64);
                  auVar65._8_4_ = -(uint)(auVar126._8_4_ < iVar26);
                  auVar65._4_4_ = auVar65._8_4_;
                  auVar65._0_4_ = auVar65._8_4_;
                  auVar65._12_4_ = auVar65._8_4_;
                  auVar114._8_4_ = iVar26;
                  auVar114._0_8_ = uVar29;
                  auVar114._12_4_ = 0;
                  auVar111 = blendvps(auVar114,auVar126,auVar65);
                  auVar126 = blendvps(auVar126,auVar99,auVar65);
                  auVar66._8_4_ = -(uint)(auVar83._8_4_ < auVar126._8_4_);
                  auVar66._4_4_ = auVar66._8_4_;
                  auVar66._0_4_ = auVar66._8_4_;
                  auVar66._12_4_ = auVar66._8_4_;
                  SVar100 = (StackItemT<embree::NodeRefPtr<4>_>)blendvps(auVar126,auVar83,auVar66);
                  SVar85 = (StackItemT<embree::NodeRefPtr<4>_>)blendvps(auVar83,auVar126,auVar66);
                  *local_11c8 = SVar85;
                  local_11c8[1] = SVar100;
                  sVar58 = auVar111._0_8_;
                  local_11c8 = local_11c8 + 2;
                }
                else {
                  lVar54 = 0;
                  if (uVar52 != 0) {
                    for (; (uVar52 >> lVar54 & 1) == 0; lVar54 = lVar54 + 1) {
                    }
                  }
                  auVar67._4_4_ = auVar64._8_4_;
                  auVar67._0_4_ = auVar64._8_4_;
                  auVar67._8_4_ = auVar64._8_4_;
                  auVar67._12_4_ = auVar64._8_4_;
                  auVar127 = blendvps(auVar113,auVar84,auVar67);
                  auVar83 = blendvps(auVar84,auVar113,auVar67);
                  auVar133._8_4_ = tNear.field_0.i[lVar54];
                  auVar133._0_8_ = *(undefined8 *)(uVar44 + lVar54 * 8);
                  auVar133._12_4_ = 0;
                  auVar68._8_4_ = -(uint)(iVar26 < tNear.field_0.i[lVar54]);
                  auVar68._4_4_ = auVar68._8_4_;
                  auVar68._0_4_ = auVar68._8_4_;
                  auVar68._12_4_ = auVar68._8_4_;
                  auVar126 = blendvps(auVar133,auVar99,auVar68);
                  auVar111 = blendvps(auVar99,auVar133,auVar68);
                  auVar69._8_4_ = -(uint)(auVar83._8_4_ < auVar111._8_4_);
                  auVar69._4_4_ = auVar69._8_4_;
                  auVar69._0_4_ = auVar69._8_4_;
                  auVar69._12_4_ = auVar69._8_4_;
                  auVar134 = blendvps(auVar111,auVar83,auVar69);
                  SVar85 = (StackItemT<embree::NodeRefPtr<4>_>)blendvps(auVar83,auVar111,auVar69);
                  auVar70._8_4_ = -(uint)(auVar127._8_4_ < auVar126._8_4_);
                  auVar70._4_4_ = auVar70._8_4_;
                  auVar70._0_4_ = auVar70._8_4_;
                  auVar70._12_4_ = auVar70._8_4_;
                  auVar83 = blendvps(auVar126,auVar127,auVar70);
                  auVar111 = blendvps(auVar127,auVar126,auVar70);
                  auVar71._8_4_ = -(uint)(auVar111._8_4_ < auVar134._8_4_);
                  auVar71._4_4_ = auVar71._8_4_;
                  auVar71._0_4_ = auVar71._8_4_;
                  auVar71._12_4_ = auVar71._8_4_;
                  SVar100 = (StackItemT<embree::NodeRefPtr<4>_>)blendvps(auVar134,auVar111,auVar71);
                  SVar128 = (StackItemT<embree::NodeRefPtr<4>_>)blendvps(auVar111,auVar134,auVar71);
                  *local_11c8 = SVar85;
                  local_11c8[1] = SVar128;
                  local_11c8[2] = SVar100;
                  sVar58 = auVar83._0_8_;
                  local_11c8 = local_11c8 + 3;
                }
              }
            }
          }
        }
        else {
          iVar42 = 6;
        }
      } while (iVar42 == 0);
    } while (iVar42 != 6);
    local_11b8 = (ulong)((uint)sVar58 & 0xf) - 8;
    if (local_11b8 != 0) {
      uVar59 = sVar58 & 0xfffffffffffffff0;
      lVar54 = 0;
      sVar58 = k;
      do {
        k = local_1258;
        lVar45 = lVar54 * 0x50;
        pSVar30 = context->scene;
        pGVar31 = (pSVar30->geometries).items[*(uint *)(uVar59 + 0x30 + lVar45)].ptr;
        fVar62 = (pGVar31->time_range).lower;
        fVar80 = (pGVar31->time_range).upper - fVar62;
        fVar122 = ((*(float *)(ray + sVar58 * 4 + 0x70) - fVar62) / fVar80) *
                  pGVar31->fnumTimeSegments;
        auVar86 = roundss(ZEXT416((uint)fVar80),ZEXT416((uint)fVar122),9);
        fVar62 = pGVar31->fnumTimeSegments + -1.0;
        if (fVar62 <= auVar86._0_4_) {
          auVar86._0_4_ = fVar62;
        }
        fVar62 = 0.0;
        if (0.0 <= auVar86._0_4_) {
          fVar62 = auVar86._0_4_;
        }
        uVar46 = (ulong)*(uint *)(uVar59 + 4 + lVar45);
        lVar32 = *(long *)(*(long *)&pGVar31[2].numPrimitives + (long)(int)fVar62 * 0x38);
        lVar33 = *(long *)(*(long *)&pGVar31[2].numPrimitives + 0x38 + (long)(int)fVar62 * 0x38);
        pfVar10 = (float *)(lVar32 + (ulong)*(uint *)(uVar59 + lVar45) * 4);
        uVar61 = (ulong)*(uint *)(uVar59 + 0x10 + lVar45);
        pfVar11 = (float *)(lVar32 + uVar61 * 4);
        fVar80 = *pfVar11;
        uVar53 = (ulong)*(uint *)(uVar59 + 0x20 + lVar45);
        pfVar12 = (float *)(lVar32 + uVar53 * 4);
        pfVar13 = (float *)(lVar32 + uVar46 * 4);
        uVar52 = (ulong)*(uint *)(uVar59 + 0x14 + lVar45);
        pfVar14 = (float *)(lVar32 + uVar52 * 4);
        fVar157 = *pfVar14;
        uVar110 = *(uint *)(uVar59 + 0x24 + lVar45);
        pfVar15 = (float *)(lVar32 + (ulong)uVar110 * 4);
        uVar60 = (ulong)*(uint *)(uVar59 + 8 + lVar45);
        pfVar16 = (float *)(lVar32 + uVar60 * 4);
        uVar57 = (ulong)*(uint *)(uVar59 + 0x18 + lVar45);
        pfVar17 = (float *)(lVar32 + uVar57 * 4);
        fVar82 = *pfVar17;
        uVar44 = (ulong)*(uint *)(uVar59 + 0x28 + lVar45);
        pfVar18 = (float *)(lVar32 + uVar44 * 4);
        uVar48 = (ulong)*(uint *)(uVar59 + 0xc + lVar45);
        pfVar19 = (float *)(lVar32 + uVar48 * 4);
        uVar56 = (ulong)*(uint *)(uVar59 + 0x1c + lVar45);
        pfVar20 = (float *)(lVar32 + uVar56 * 4);
        fVar92 = *pfVar20;
        uVar50 = (ulong)*(uint *)(uVar59 + 0x2c + lVar45);
        pfVar21 = (float *)(lVar32 + uVar50 * 4);
        pfVar9 = (float *)(lVar33 + (ulong)*(uint *)(uVar59 + lVar45) * 4);
        puVar1 = (undefined8 *)(lVar33 + uVar61 * 4);
        uVar29 = *puVar1;
        uVar38 = puVar1[1];
        fVar122 = fVar122 - fVar62;
        pfVar22 = (float *)(lVar33 + uVar46 * 4);
        pfVar23 = (float *)(lVar33 + uVar60 * 4);
        local_1038 = CONCAT44(fVar157,fVar80);
        _local_1028 = CONCAT44(fVar92,fVar82);
        pfVar24 = (float *)(lVar33 + uVar48 * 4);
        pfVar2 = (float *)(lVar33 + uVar57 * 4);
        local_1268 = (float)uVar29;
        fStack_1264 = (float)((ulong)uVar29 >> 0x20);
        fStack_1260 = (float)uVar38;
        pfVar3 = (float *)(lVar33 + uVar52 * 4);
        pfVar4 = (float *)(lVar33 + uVar56 * 4);
        local_1258 = CONCAT44(pfVar4[2],pfVar2[2]);
        pfVar5 = (float *)(lVar33 + uVar53 * 4);
        pfVar6 = (float *)(lVar33 + uVar44 * 4);
        pfVar7 = (float *)(lVar33 + (ulong)uVar110 * 4);
        pfVar8 = (float *)(lVar33 + uVar50 * 4);
        fVar62 = 1.0 - fVar122;
        fVar144 = *pfVar10 * fVar62 + *pfVar9 * fVar122;
        fVar146 = *pfVar13 * fVar62 + *pfVar22 * fVar122;
        fVar148 = *pfVar16 * fVar62 + *pfVar23 * fVar122;
        fVar150 = *pfVar19 * fVar62 + *pfVar24 * fVar122;
        fVar97 = pfVar10[1] * fVar62 + pfVar9[1] * fVar122;
        fVar103 = pfVar13[1] * fVar62 + pfVar22[1] * fVar122;
        fVar105 = pfVar16[1] * fVar62 + pfVar23[1] * fVar122;
        fVar107 = pfVar19[1] * fVar62 + pfVar24[1] * fVar122;
        fVar132 = pfVar10[2] * fVar62 + pfVar9[2] * fVar122;
        fVar135 = pfVar13[2] * fVar62 + pfVar22[2] * fVar122;
        fVar136 = fStack_1230 * fVar62 + pfVar23[2] * fVar122;
        fVar137 = fStack_122c * fVar62 + pfVar24[2] * fVar122;
        fStack_125c = (float)((ulong)uVar38 >> 0x20);
        puVar1 = (undefined8 *)(uVar59 + 0x30 + lVar45);
        local_1018 = *puVar1;
        uStack_1010 = puVar1[1];
        puVar1 = (undefined8 *)(uVar59 + 0x40 + lVar45);
        local_1178 = *puVar1;
        uStack_1170 = puVar1[1];
        fVar81 = fVar144 - (fVar80 * fVar62 + local_1268 * fVar122);
        fVar91 = fVar146 - (fVar157 * fVar62 + *pfVar3 * fVar122);
        fVar93 = fVar148 - (fStack_1030 * fVar62 + *pfVar2 * fVar122);
        fVar95 = fVar150 - (fStack_102c * fVar62 + *pfVar4 * fVar122);
        fVar123 = fVar97 - (pfVar11[1] * fVar62 + fStack_1264 * fVar122);
        fVar129 = fVar103 - (pfVar14[1] * fVar62 + pfVar3[1] * fVar122);
        fVar130 = fVar105 - (pfVar17[1] * fVar62 + pfVar2[1] * fVar122);
        fVar131 = fVar107 - (pfVar20[1] * fVar62 + pfVar4[1] * fVar122);
        fVar155 = fVar132 - (fVar82 * fVar62 + fStack_1260 * fVar122);
        fVar158 = fVar135 - (fVar92 * fVar62 + pfVar3[2] * fVar122);
        fVar160 = fVar136 - (fStack_1020 * fVar62 + fStack_1260 * fVar122);
        fVar162 = fVar137 - (fStack_101c * fVar62 + fStack_125c * fVar122);
        fVar151 = (*pfVar12 * fVar62 + *pfVar5 * fVar122) - fVar144;
        fVar152 = (*pfVar15 * fVar62 + *pfVar7 * fVar122) - fVar146;
        fVar153 = (*pfVar18 * fVar62 + *pfVar6 * fVar122) - fVar148;
        fVar154 = (*pfVar21 * fVar62 + *pfVar8 * fVar122) - fVar150;
        fVar109 = (pfVar12[1] * fVar62 + pfVar5[1] * fVar122) - fVar97;
        fVar116 = (pfVar15[1] * fVar62 + pfVar7[1] * fVar122) - fVar103;
        fVar118 = (pfVar18[1] * fVar62 + pfVar6[1] * fVar122) - fVar105;
        fVar120 = (pfVar21[1] * fVar62 + pfVar8[1] * fVar122) - fVar107;
        fVar140 = (fVar62 * pfVar12[2] + fVar122 * pfVar5[2]) - fVar132;
        fVar141 = (fVar62 * pfVar15[2] + fVar122 * pfVar7[2]) - fVar135;
        fVar142 = (fVar62 * pfVar18[2] + fVar122 * pfVar6[2]) - fVar136;
        fVar143 = (fVar62 * pfVar21[2] + fVar122 * pfVar8[2]) - fVar137;
        fVar98 = fVar155 * fVar109 - fVar123 * fVar140;
        fVar104 = fVar158 * fVar116 - fVar129 * fVar141;
        local_10d8._4_4_ = fVar104;
        local_10d8._0_4_ = fVar98;
        fVar106 = fVar160 * fVar118 - fVar130 * fVar142;
        fVar108 = fVar162 * fVar120 - fVar131 * fVar143;
        fVar62 = *(float *)(ray + k * 4);
        fVar80 = *(float *)(ray + k * 4 + 0x10);
        fVar122 = *(float *)(ray + k * 4 + 0x40);
        fVar157 = *(float *)(ray + k * 4 + 0x50);
        fVar144 = fVar144 - fVar62;
        fVar146 = fVar146 - fVar62;
        fVar148 = fVar148 - fVar62;
        fVar150 = fVar150 - fVar62;
        fVar97 = fVar97 - fVar80;
        fVar103 = fVar103 - fVar80;
        fVar105 = fVar105 - fVar80;
        fVar107 = fVar107 - fVar80;
        fVar164 = fVar144 * fVar157 - fVar97 * fVar122;
        fVar165 = fVar146 * fVar157 - fVar103 * fVar122;
        fVar166 = fVar148 * fVar157 - fVar105 * fVar122;
        fVar167 = fVar150 * fVar157 - fVar107 * fVar122;
        fVar82 = fVar81 * fVar140 - fVar155 * fVar151;
        fVar92 = fVar91 * fVar141 - fVar158 * fVar152;
        fVar94 = fVar93 * fVar142 - fVar160 * fVar153;
        fVar96 = fVar95 * fVar143 - fVar162 * fVar154;
        fVar62 = *(float *)(ray + k * 4 + 0x20);
        fVar80 = *(float *)(ray + k * 4 + 0x60);
        fVar132 = fVar132 - fVar62;
        fVar135 = fVar135 - fVar62;
        fStack_1230 = fVar136 - fVar62;
        fStack_122c = fVar137 - fVar62;
        fVar62 = fVar132 * fVar122 - fVar144 * fVar80;
        fVar136 = fVar135 * fVar122 - fVar146 * fVar80;
        fVar137 = fStack_1230 * fVar122 - fVar148 * fVar80;
        fVar139 = fStack_122c * fVar122 - fVar150 * fVar80;
        local_10b8._0_4_ = fVar123 * fVar151 - fVar81 * fVar109;
        local_10b8._4_4_ = fVar129 * fVar152 - fVar91 * fVar116;
        local_10b8._8_4_ = fVar130 * fVar153 - fVar93 * fVar118;
        local_10b8._12_4_ = fVar131 * fVar154 - fVar95 * fVar120;
        fVar156 = fVar97 * fVar80 - fVar132 * fVar157;
        fVar159 = fVar103 * fVar80 - fVar135 * fVar157;
        fVar161 = fVar105 * fVar80 - fStack_1230 * fVar157;
        fVar163 = fVar107 * fVar80 - fStack_122c * fVar157;
        fVar145 = fVar122 * fVar98 + fVar157 * fVar82 + fVar80 * local_10b8._0_4_;
        fVar147 = fVar122 * fVar104 + fVar157 * fVar92 + fVar80 * local_10b8._4_4_;
        fVar149 = fVar122 * fVar106 + fVar157 * fVar94 + fVar80 * local_10b8._8_4_;
        fVar122 = fVar122 * fVar108 + fVar157 * fVar96 + fVar80 * local_10b8._12_4_;
        uVar110 = (uint)fVar145 & 0x80000000;
        uVar117 = (uint)fVar147 & 0x80000000;
        uVar119 = (uint)fVar149 & 0x80000000;
        uVar121 = (uint)fVar122 & 0x80000000;
        tNear.field_0.i[0] =
             (uint)(fVar151 * fVar156 + fVar109 * fVar62 + fVar140 * fVar164) ^ uVar110;
        tNear.field_0.i[1] =
             (uint)(fVar152 * fVar159 + fVar116 * fVar136 + fVar141 * fVar165) ^ uVar117;
        tNear.field_0.i[2] =
             (uint)(fVar153 * fVar161 + fVar118 * fVar137 + fVar142 * fVar166) ^ uVar119;
        tNear.field_0.i[3] =
             (uint)(fVar154 * fVar163 + fVar120 * fVar139 + fVar143 * fVar167) ^ uVar121;
        fVar157 = (float)((uint)(fVar156 * fVar81 + fVar62 * fVar123 + fVar164 * fVar155) ^ uVar110)
        ;
        fVar81 = (float)((uint)(fVar159 * fVar91 + fVar136 * fVar129 + fVar165 * fVar158) ^ uVar117)
        ;
        fVar91 = (float)((uint)(fVar161 * fVar93 + fVar137 * fVar130 + fVar166 * fVar160) ^ uVar119)
        ;
        fVar93 = (float)((uint)(fVar163 * fVar95 + fVar139 * fVar131 + fVar167 * fVar162) ^ uVar121)
        ;
        fVar62 = ABS(fVar145);
        fVar80 = ABS(fVar147);
        auVar87._0_8_ = CONCAT44(fVar147,fVar145) & 0x7fffffff7fffffff;
        auVar87._8_4_ = ABS(fVar149);
        auVar87._12_4_ = ABS(fVar122);
        bVar36 = tNear.field_0.v[0] + fVar157 <= fVar62 &&
                 ((0.0 <= fVar157 && 0.0 <= tNear.field_0.v[0]) && fVar145 != 0.0);
        auVar138._0_4_ = -(uint)bVar36;
        bVar37 = tNear.field_0.v[1] + fVar81 <= fVar80 &&
                 ((0.0 <= fVar81 && 0.0 <= tNear.field_0.v[1]) && fVar147 != 0.0);
        auVar138._4_4_ = -(uint)bVar37;
        bVar35 = tNear.field_0.v[2] + fVar91 <= auVar87._8_4_ &&
                 ((0.0 <= fVar91 && 0.0 <= tNear.field_0.v[2]) && fVar149 != 0.0);
        auVar138._8_4_ = -(uint)bVar35;
        bVar34 = tNear.field_0.v[3] + fVar93 <= auVar87._12_4_ &&
                 ((0.0 <= fVar93 && 0.0 <= tNear.field_0.v[3]) && fVar122 != 0.0);
        auVar138._12_4_ = -(uint)bVar34;
        iVar43 = movmskps((int)lVar45,auVar138);
        if (iVar43 != 0) {
          fVar95 = (float)(uVar110 ^
                          (uint)(fVar144 * fVar98 + fVar97 * fVar82 + fVar132 * local_10b8._0_4_));
          fVar135 = (float)(uVar117 ^
                           (uint)(fVar146 * fVar104 + fVar103 * fVar92 + fVar135 * local_10b8._4_4_)
                           );
          fVar97 = (float)(uVar119 ^
                          (uint)(fVar148 * fVar106 +
                                fVar105 * fVar94 + fStack_1230 * local_10b8._8_4_));
          fVar98 = (float)(uVar121 ^
                          (uint)(fVar150 * fVar108 +
                                fVar107 * fVar96 + fStack_122c * local_10b8._12_4_));
          fVar122 = *(float *)(ray + k * 4 + 0x30);
          fVar132 = *(float *)(ray + k * 4 + 0x80);
          valid.field_0.i[0] =
               -(uint)((fVar95 <= fVar132 * fVar62 && fVar122 * fVar62 < fVar95) && bVar36);
          valid.field_0.i[1] =
               -(uint)((fVar135 <= fVar132 * fVar80 && fVar122 * fVar80 < fVar135) && bVar37);
          valid.field_0.i[2] =
               -(uint)((fVar97 <= fVar132 * auVar87._8_4_ && fVar122 * auVar87._8_4_ < fVar97) &&
                      bVar35);
          valid.field_0.i[3] =
               -(uint)((fVar98 <= fVar132 * auVar87._12_4_ && fVar122 * auVar87._12_4_ < fVar98) &&
                      bVar34);
          iVar43 = movmskps(iVar43,(undefined1  [16])valid.field_0);
          if (iVar43 != 0) {
            local_10d8._8_4_ = fVar106;
            local_10d8._12_4_ = fVar108;
            local_10c8._4_4_ = fVar92;
            local_10c8._0_4_ = fVar82;
            local_10c8._8_4_ = fVar94;
            local_10c8._12_4_ = fVar96;
            auVar75 = rcpps(local_10c8,auVar87);
            fVar122 = auVar75._0_4_;
            fVar82 = auVar75._4_4_;
            fVar92 = auVar75._8_4_;
            fVar132 = auVar75._12_4_;
            fVar122 = (1.0 - fVar62 * fVar122) * fVar122 + fVar122;
            fVar82 = (1.0 - fVar80 * fVar82) * fVar82 + fVar82;
            fVar92 = (1.0 - auVar87._8_4_ * fVar92) * fVar92 + fVar92;
            fVar132 = (1.0 - auVar87._12_4_ * fVar132) * fVar132 + fVar132;
            auVar115._0_4_ = fVar95 * fVar122;
            auVar115._4_4_ = fVar135 * fVar82;
            auVar115._8_4_ = fVar97 * fVar92;
            auVar115._12_4_ = fVar98 * fVar132;
            local_10e8 = auVar115;
            local_1108[0] = tNear.field_0.v[0] * fVar122;
            local_1108[1] = tNear.field_0.v[1] * fVar82;
            local_1108[2] = tNear.field_0.v[2] * fVar92;
            local_1108[3] = tNear.field_0.v[3] * fVar132;
            local_10f8[0] = fVar122 * fVar157;
            local_10f8[1] = fVar82 * fVar81;
            local_10f8[2] = fVar92 * fVar91;
            local_10f8[3] = fVar132 * fVar93;
            auVar83 = blendvps(_DAT_01feb9f0,auVar115,(undefined1  [16])valid.field_0);
            auVar101._4_4_ = auVar83._0_4_;
            auVar101._0_4_ = auVar83._4_4_;
            auVar101._8_4_ = auVar83._12_4_;
            auVar101._12_4_ = auVar83._8_4_;
            auVar75 = minps(auVar101,auVar83);
            auVar76._0_8_ = auVar75._8_8_;
            auVar76._8_4_ = auVar75._0_4_;
            auVar76._12_4_ = auVar75._4_4_;
            auVar75 = minps(auVar76,auVar75);
            uVar110 = -(uint)(auVar75._0_4_ == auVar83._0_4_);
            uVar117 = -(uint)(auVar75._4_4_ == auVar83._4_4_);
            uVar119 = -(uint)(auVar75._8_4_ == auVar83._8_4_);
            uVar121 = -(uint)(auVar75._12_4_ == auVar83._12_4_);
            auVar90._4_4_ = uVar117;
            auVar90._0_4_ = uVar110;
            auVar88._0_4_ = uVar110 & valid.field_0.i[0];
            auVar88._4_4_ = uVar117 & valid.field_0.i[1];
            auVar88._8_4_ = uVar119 & valid.field_0.i[2];
            auVar88._12_4_ = uVar121 & valid.field_0.i[3];
            iVar43 = movmskps(iVar43,auVar88);
            auVar89._8_4_ = 0xffffffff;
            auVar89._0_8_ = 0xffffffffffffffff;
            auVar89._12_4_ = 0xffffffff;
            if (iVar43 != 0) {
              auVar90._8_4_ = uVar119;
              auVar90._12_4_ = uVar121;
              auVar89 = auVar90;
            }
            auVar72._0_4_ = valid.field_0.i[0] & auVar89._0_4_;
            auVar72._4_4_ = valid.field_0.i[1] & auVar89._4_4_;
            auVar72._8_4_ = valid.field_0.i[2] & auVar89._8_4_;
            auVar72._12_4_ = valid.field_0.i[3] & auVar89._12_4_;
            uVar55 = movmskps(iVar43,auVar72);
            uVar46 = CONCAT44((int)((ulong)lVar45 >> 0x20),uVar55);
            lVar45 = 0;
            local_11c0 = pSVar30;
            local_11b0 = lVar54;
            if (uVar46 != 0) {
              for (; (uVar46 >> lVar45 & 1) == 0; lVar45 = lVar45 + 1) {
              }
            }
LAB_0027523b:
            h.geomID.field_0.i[0] = *(uint *)((long)&local_1018 + lVar45 * 4);
            pRVar47 = (RayHitK<4> *)(ulong)h.geomID.field_0.i[0];
            pGVar31 = (pSVar30->geometries).items[(long)pRVar47].ptr;
            if ((pGVar31->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) {
              valid.field_0.v[lVar45] = 0.0;
            }
            else {
              if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                 (pGVar31->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                fVar62 = local_1108[lVar45];
                fVar80 = local_10f8[lVar45];
                *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_10e8 + lVar45 * 4);
                *(undefined4 *)(ray + k * 4 + 0xc0) = *(undefined4 *)(local_10d8 + lVar45 * 4);
                *(undefined4 *)(ray + k * 4 + 0xd0) = *(undefined4 *)(local_10c8 + lVar45 * 4);
                *(undefined4 *)(ray + k * 4 + 0xe0) = *(undefined4 *)(local_10b8 + lVar45 * 4);
                *(float *)(ray + k * 4 + 0xf0) = fVar62;
                *(float *)(ray + k * 4 + 0x100) = fVar80;
                *(undefined4 *)(ray + k * 4 + 0x110) =
                     *(undefined4 *)((long)&local_1178 + lVar45 * 4);
                *(undefined4 *)(ray + k * 4 + 0x120) = h.geomID.field_0.i[0];
                *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
                goto LAB_002750dc;
              }
              h.u.field_0.v[0] = local_1108[lVar45];
              h.v.field_0.v[0] = local_10f8[lVar45];
              uVar55 = *(undefined4 *)(local_10d8 + lVar45 * 4);
              uVar25 = *(undefined4 *)(local_10c8 + lVar45 * 4);
              uVar27 = *(undefined4 *)((long)&local_1178 + lVar45 * 4);
              h.primID.field_0.i[1] = uVar27;
              h.primID.field_0.i[0] = uVar27;
              h.primID.field_0.i[2] = uVar27;
              h.primID.field_0.i[3] = uVar27;
              h.Ng.field_0._4_4_ = uVar55;
              h.Ng.field_0._0_4_ = uVar55;
              h.Ng.field_0._8_4_ = uVar55;
              h.Ng.field_0._12_4_ = uVar55;
              h.Ng.field_0._20_4_ = uVar25;
              h.Ng.field_0._16_4_ = uVar25;
              h.Ng.field_0._24_4_ = uVar25;
              h.Ng.field_0._28_4_ = uVar25;
              uVar55 = *(undefined4 *)(local_10b8 + lVar45 * 4);
              h.Ng.field_0._36_4_ = uVar55;
              h.Ng.field_0._32_4_ = uVar55;
              h.Ng.field_0._40_4_ = uVar55;
              h.Ng.field_0._44_4_ = uVar55;
              h.u.field_0.v[1] = h.u.field_0.v[0];
              h.u.field_0.v[2] = h.u.field_0.v[0];
              h.u.field_0.v[3] = h.u.field_0.v[0];
              h.v.field_0.v[1] = h.v.field_0.v[0];
              h.v.field_0.v[2] = h.v.field_0.v[0];
              h.v.field_0.v[3] = h.v.field_0.v[0];
              h.geomID.field_0.i[1] = h.geomID.field_0.i[0];
              h.geomID.field_0.i[2] = h.geomID.field_0.i[0];
              h.geomID.field_0.i[3] = h.geomID.field_0.i[0];
              h.instID[0].field_0.i[0] = context->user->instID[0];
              h.instID[0].field_0.i[1] = h.instID[0].field_0.i[0];
              h.instID[0].field_0.i[2] = h.instID[0].field_0.i[0];
              h.instID[0].field_0.i[3] = h.instID[0].field_0.i[0];
              h.instPrimID[0].field_0.i[0] = context->user->instPrimID[0];
              h.instPrimID[0].field_0.i[1] = h.instPrimID[0].field_0.i[0];
              h.instPrimID[0].field_0.i[2] = h.instPrimID[0].field_0.i[0];
              h.instPrimID[0].field_0.i[3] = h.instPrimID[0].field_0.i[0];
              uVar55 = *(undefined4 *)(ray + k * 4 + 0x80);
              *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_10e8 + lVar45 * 4);
              local_1208 = *local_11f0;
              uStack_1200 = local_11f0[1];
              args.valid = (int *)&local_1208;
              args.geometryUserPtr = pGVar31->userPtr;
              args.context = context->user;
              args.hit = (RTCHitN *)&h;
              args.N = 4;
              pRVar47 = (RayHitK<4> *)pGVar31->intersectionFilterN;
              args.ray = (RTCRayN *)ray;
              if (pRVar47 != (RayHitK<4> *)0x0) {
                pRVar47 = (RayHitK<4> *)(*(code *)pRVar47)(&args);
              }
              auVar39._8_8_ = uStack_1200;
              auVar39._0_8_ = local_1208;
              if (auVar39 == (undefined1  [16])0x0) {
                auVar77._8_4_ = 0xffffffff;
                auVar77._0_8_ = 0xffffffffffffffff;
                auVar77._12_4_ = 0xffffffff;
                auVar77 = auVar77 ^ _DAT_01febe20;
              }
              else {
                pRVar47 = (RayHitK<4> *)context->args->filter;
                if ((pRVar47 != (RayHitK<4> *)0x0) &&
                   (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                     RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar31->field_8).field_0x2 & 0x40) != 0)))
                   ) {
                  pRVar47 = (RayHitK<4> *)(*(code *)pRVar47)(&args);
                }
                auVar40._8_8_ = uStack_1200;
                auVar40._0_8_ = local_1208;
                auVar73._0_4_ = -(uint)((int)local_1208 == 0);
                auVar73._4_4_ = -(uint)((int)((ulong)local_1208 >> 0x20) == 0);
                auVar73._8_4_ = -(uint)((int)uStack_1200 == 0);
                auVar73._12_4_ = -(uint)((int)((ulong)uStack_1200 >> 0x20) == 0);
                auVar77 = auVar73 ^ _DAT_01febe20;
                if (auVar40 != (undefined1  [16])0x0) {
                  auVar75 = blendvps(*(undefined1 (*) [16])args.hit,
                                     *(undefined1 (*) [16])(args.ray + 0xc0),auVar73);
                  *(undefined1 (*) [16])(args.ray + 0xc0) = auVar75;
                  auVar75 = blendvps(*(undefined1 (*) [16])(args.hit + 0x10),
                                     *(undefined1 (*) [16])(args.ray + 0xd0),auVar73);
                  *(undefined1 (*) [16])(args.ray + 0xd0) = auVar75;
                  auVar75 = blendvps(*(undefined1 (*) [16])(args.hit + 0x20),
                                     *(undefined1 (*) [16])(args.ray + 0xe0),auVar73);
                  *(undefined1 (*) [16])(args.ray + 0xe0) = auVar75;
                  auVar75 = blendvps(*(undefined1 (*) [16])(args.hit + 0x30),
                                     *(undefined1 (*) [16])(args.ray + 0xf0),auVar73);
                  *(undefined1 (*) [16])(args.ray + 0xf0) = auVar75;
                  auVar75 = blendvps(*(undefined1 (*) [16])(args.hit + 0x40),
                                     *(undefined1 (*) [16])(args.ray + 0x100),auVar73);
                  *(undefined1 (*) [16])(args.ray + 0x100) = auVar75;
                  auVar75 = blendvps(*(undefined1 (*) [16])(args.hit + 0x50),
                                     *(undefined1 (*) [16])(args.ray + 0x110),auVar73);
                  *(undefined1 (*) [16])(args.ray + 0x110) = auVar75;
                  auVar75 = blendvps(*(undefined1 (*) [16])(args.hit + 0x60),
                                     *(undefined1 (*) [16])(args.ray + 0x120),auVar73);
                  *(undefined1 (*) [16])(args.ray + 0x120) = auVar75;
                  auVar75 = blendvps(*(undefined1 (*) [16])(args.hit + 0x70),
                                     *(undefined1 (*) [16])(args.ray + 0x130),auVar73);
                  *(undefined1 (*) [16])(args.ray + 0x130) = auVar75;
                  auVar75 = blendvps(*(undefined1 (*) [16])(args.hit + 0x80),
                                     *(undefined1 (*) [16])(args.ray + 0x140),auVar73);
                  *(undefined1 (*) [16])(args.ray + 0x140) = auVar75;
                  pRVar47 = (RayHitK<4> *)args.ray;
                }
              }
              if ((_DAT_01fecb20 & auVar77) == (undefined1  [16])0x0) {
                *(undefined4 *)(ray + local_1258 * 4 + 0x80) = uVar55;
                pRVar47 = ray;
              }
              valid.field_0.v[lVar45] = 0.0;
              fVar62 = *(float *)(ray + local_1258 * 4 + 0x80);
              valid.field_0.i[1] = -(uint)(auVar115._4_4_ <= fVar62) & valid.field_0.i[1];
              valid.field_0.i[0] = -(uint)(auVar115._0_4_ <= fVar62) & valid.field_0.i[0];
              valid.field_0.i[2] = -(uint)(auVar115._8_4_ <= fVar62) & valid.field_0.i[2];
              valid.field_0.i[3] = -(uint)(auVar115._12_4_ <= fVar62) & valid.field_0.i[3];
              k = local_1258;
            }
            iVar43 = movmskps((int)pRVar47,(undefined1  [16])valid.field_0);
            if (iVar43 == 0) goto LAB_002750dc;
            auVar83 = blendvps(_DAT_01feb9f0,auVar115,(undefined1  [16])valid.field_0);
            auVar102._4_4_ = auVar83._0_4_;
            auVar102._0_4_ = auVar83._4_4_;
            auVar102._8_4_ = auVar83._12_4_;
            auVar102._12_4_ = auVar83._8_4_;
            auVar75 = minps(auVar102,auVar83);
            auVar78._0_8_ = auVar75._8_8_;
            auVar78._8_4_ = auVar75._0_4_;
            auVar78._12_4_ = auVar75._4_4_;
            auVar75 = minps(auVar78,auVar75);
            auVar79._0_8_ =
                 CONCAT44(-(uint)(auVar75._4_4_ == auVar83._4_4_) & valid.field_0._4_4_,
                          -(uint)(auVar75._0_4_ == auVar83._0_4_) & valid.field_0._0_4_);
            auVar79._8_4_ = -(uint)(auVar75._8_4_ == auVar83._8_4_) & valid.field_0._8_4_;
            auVar79._12_4_ = -(uint)(auVar75._12_4_ == auVar83._12_4_) & valid.field_0._12_4_;
            iVar43 = movmskps(iVar43,auVar79);
            aVar74 = valid.field_0;
            if (iVar43 != 0) {
              aVar74.i[2] = auVar79._8_4_;
              aVar74._0_8_ = auVar79._0_8_;
              aVar74.i[3] = auVar79._12_4_;
            }
            uVar55 = movmskps(iVar43,(undefined1  [16])aVar74);
            uVar46 = CONCAT44((int)((ulong)pRVar47 >> 0x20),uVar55);
            lVar45 = 0;
            if (uVar46 != 0) {
              for (; (uVar46 >> lVar45 & 1) == 0; lVar45 = lVar45 + 1) {
              }
            }
            goto LAB_0027523b;
          }
        }
LAB_002750dc:
        lVar54 = lVar54 + 1;
        sVar58 = k;
      } while (lVar54 != local_11b8);
    }
    uVar55 = *(undefined4 *)(ray + k * 4 + 0x80);
    auVar75._4_4_ = uVar55;
    auVar75._0_4_ = uVar55;
    auVar75._8_4_ = uVar55;
    auVar75._12_4_ = uVar55;
    uVar59 = local_11e8;
    uVar46 = local_11e0;
    uVar48 = local_11d0;
    uVar50 = local_11d8;
    fVar62 = local_1048;
    fVar80 = fStack_1044;
    fVar122 = fStack_1040;
    fVar157 = fStack_103c;
    fVar82 = local_1058;
    fVar92 = fStack_1054;
    fVar132 = fStack_1050;
    fVar135 = fStack_104c;
    fVar81 = local_1068;
    fVar91 = fStack_1064;
    fVar93 = fStack_1060;
    fVar94 = fStack_105c;
    fVar95 = local_1078;
    fVar96 = fStack_1074;
    fVar97 = fStack_1070;
    fVar98 = fStack_106c;
    fVar103 = local_1088;
    fVar104 = fStack_1084;
    fVar105 = fStack_1080;
    fVar106 = fStack_107c;
    fVar107 = local_1098;
    fVar108 = fStack_1094;
    fVar109 = fStack_1090;
    fVar116 = fStack_108c;
    iVar43 = local_10a8;
    iVar168 = iStack_10a4;
    iVar169 = iStack_10a0;
    iVar170 = iStack_109c;
  } while( true );
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::intersect1(Accel::Intersectors* This,
                                                                                                const BVH* bvh,
                                                                                                NodeRef root,
                                                                                                size_t k,
                                                                                                Precalculations& pre,
                                                                                                RayHitK<K>& ray,
                                                                                                const TravRayK<K, robust>& tray,
                                                                                                RayQueryContext* context)
    {
      /* stack state */
      StackItemT<NodeRef> stack[stackSizeSingle];  // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack + 1;   // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack + stackSizeSingle;
      stack[0].ptr = root;
      stack[0].dist = neg_inf;

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray1;
      tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar[k]))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes, 1, 1, 1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          BVHNNodeTraverser1Hit<N, types>::traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves, 1, 1, 1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

        size_t lazy_node = 0;
        PrimitiveIntersectorK::intersect(This, pre, ray, k, context, prim, num, tray1, lazy_node);

        tray1.tfar = ray.tfar[k];

        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }